

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_details::load(xr_level_details *this,xr_reader *r)

{
  uint __line;
  size_t sVar1;
  xr_reader *this_00;
  xr_dm *this_01;
  detail_slot_v3 *pdVar2;
  uint32_t uVar3;
  char *__assertion;
  ulong uVar4;
  xr_dm *dm;
  xr_reader *s;
  
  sVar1 = xr_reader::find_chunk(r,0);
  if (sVar1 == 0) {
    __assertion = "0";
    __line = 0x3a;
  }
  else {
    details_header::load(&this->m_header,r);
    if (((this->m_header).version & 0xfffffffe) == 2) {
      uVar4 = (ulong)(this->m_header).object_count;
      if (uVar4 != 0) {
        std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::reserve
                  (&this->m_models,uVar4);
        this_00 = xr_reader::open_chunk(r,1);
        s = this_00;
        if (this_00 == (xr_reader *)0x0) {
          __assertion = "s";
          __line = 0x44;
          goto LAB_00159e3c;
        }
        uVar3 = 0;
        while( true ) {
          sVar1 = xr_reader::find_chunk(this_00,uVar3);
          if (sVar1 == 0) break;
          this_01 = (xr_dm *)operator_new(0x250);
          memset(this_01,0,0x250);
          xr_level_dm::xr_level_dm((xr_level_dm *)this_01);
          dm = this_01;
          xr_dm::load_dm(this_01,this_00);
          std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::push_back
                    (&this->m_models,&dm);
          uVar3 = uVar3 + 1;
        }
        xr_reader::close_chunk(r,&s);
        sVar1 = xr_reader::find_chunk(r,2);
        uVar3 = (this->m_header).version;
        if (uVar3 == 2) {
          uVar4 = sVar1 / 0x16;
          if ((sVar1 == 0) || (sVar1 % 0x16 != 0)) {
            __assertion = "size && (size % sizeof(detail_slot_v2) == 0)";
            __line = 0x4e;
            goto LAB_00159e3c;
          }
          pdVar2 = (detail_slot_v3 *)operator_new__(uVar4 << 4);
          this->m_slots = pdVar2;
          xr_reader::r_cseq<xray_re::detail_slot_v3,read_slot_v2>(r,uVar4,pdVar2);
        }
        else {
          if (uVar3 != 3) {
            __assertion = "0";
            __line = 0x56;
            goto LAB_00159e3c;
          }
          if ((sVar1 == 0) || ((sVar1 & 0xf) != 0)) {
            __assertion = "size && (size % sizeof(detail_slot_v3) == 0)";
            __line = 0x52;
            goto LAB_00159e3c;
          }
          uVar4 = sVar1 >> 4;
          pdVar2 = (detail_slot_v3 *)operator_new__(sVar1);
          this->m_slots = pdVar2;
          xr_reader::r_cseq<xray_re::detail_slot_v3>(r,uVar4,pdVar2);
        }
        if (uVar4 != (this->m_header).size_z * (this->m_header).size_x) {
          __assertion = "size == num_slots()";
          __line = 0x58;
          goto LAB_00159e3c;
        }
      }
      return;
    }
    __assertion = "m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3";
    __line = 0x3d;
  }
LAB_00159e3c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                ,__line,"void xray_re::xr_level_details::load(xr_reader &)");
}

Assistant:

void xr_level_details::load(xr_reader& r)
{
	if (!r.find_chunk(FSD_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();
	xr_assert(m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3);

	if (m_header.object_count == 0)
		return;

	m_models.reserve(m_header.object_count);
	xr_reader* s = r.open_chunk(FSD_MESHES);
	xr_assert(s);
	for (uint32_t id = 0; s->find_chunk(id); ++id) {
		xr_dm* dm = new xr_level_dm();
		dm->load_dm(*s);
		m_models.push_back(dm);
	}
	r.close_chunk(s);

	size_t size = r.find_chunk(FSD_SLOTS);
	if (m_header.version == DETAILS_VERSION_2) {
		xr_assert(size && (size % sizeof(detail_slot_v2) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v2)];
		r.r_cseq(size, m_slots, read_slot_v2());
	} else if (m_header.version == DETAILS_VERSION_3) {
		xr_assert(size && (size % sizeof(detail_slot_v3) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v3)];
		r.r_cseq(size, m_slots);
	} else {
		xr_not_expected();
	}
	xr_assert(size == num_slots());
}